

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

SUNErrCode N_VBufUnpack_Serial(N_Vector x,void *buf)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *x->content;
  if (0 < lVar1) {
    lVar2 = *(long *)((long)x->content + 0x10);
    lVar3 = 0;
    do {
      *(undefined8 *)(lVar2 + lVar3 * 8) = *(undefined8 *)((long)buf + lVar3 * 8);
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  return 0;
}

Assistant:

SUNErrCode N_VBufUnpack_Serial(N_Vector x, void* buf)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i, N;
  sunrealtype* xd = NULL;
  sunrealtype* bd = NULL;

  SUNAssert(buf, SUN_ERR_ARG_CORRUPT);

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  bd = (sunrealtype*)buf;

  for (i = 0; i < N; i++) { xd[i] = bd[i]; }

  return SUN_SUCCESS;
}